

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O1

int av1_get_pred_context_single_ref_p3(MACROBLOCKD *xd)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (uint)xd->neighbors_ref_counts[2] + (uint)xd->neighbors_ref_counts[1];
  uVar3 = (uint)xd->neighbors_ref_counts[4] + (uint)xd->neighbors_ref_counts[3];
  iVar1 = 1;
  if (uVar2 != uVar3) {
    iVar1 = (uint)(uVar3 <= uVar2) * 2;
  }
  return iVar1;
}

Assistant:

static int get_pred_context_ll2_or_l3gld(const MACROBLOCKD *xd) {
  const uint8_t *const ref_counts = &xd->neighbors_ref_counts[0];

  // Count of LAST + LAST2
  const int last_last2_count = ref_counts[LAST_FRAME] + ref_counts[LAST2_FRAME];
  // Count of LAST3 + GOLDEN
  const int last3_gld_count =
      ref_counts[LAST3_FRAME] + ref_counts[GOLDEN_FRAME];

  const int pred_context = (last_last2_count == last3_gld_count)
                               ? 1
                               : ((last_last2_count < last3_gld_count) ? 0 : 2);

  assert(pred_context >= 0 && pred_context < REF_CONTEXTS);
  return pred_context;
}